

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O1

wchar_t scp_get_sink_action(scp_sink_action *act)

{
  strbuf *psVar1;
  StripCtrlChars *pSVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  sftp_request *psVar6;
  sftp_packet *psVar7;
  char *pcVar8;
  fxp_handle *handle;
  fxp_names *names;
  scp_sftp_dirstack *psVar9;
  char **ppcVar10;
  wchar_t wVar11;
  int iVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  char *fmt;
  undefined8 *puVar16;
  FILE *pFVar17;
  fxp_name *pfVar18;
  char *unaff_R12;
  long lVar19;
  scp_sftp_dirstack *ptr;
  long lVar20;
  byte bVar21;
  ptrlen str;
  ptrlen str_00;
  ptrlen str_01;
  ptrlen str_02;
  ptrlen str_03;
  ptrlen str_04;
  ptrlen str_05;
  size_t namesize;
  fxp_attrs attrs;
  fxp_name *local_a0;
  size_t local_98;
  size_t local_90;
  undefined8 local_88;
  char *local_80;
  scp_sftp_dirstack *local_78;
  fxp_handle *local_70;
  fxp_attrs local_68;
  
  ptr = scp_sftp_dirstack_head;
  bVar21 = 0;
  if (!using_sftp) {
    act->settime = false;
    strbuf_shrink_to(act->buf,0);
    _Var3 = ssh_scp_recv(&local_98,1);
    if (!_Var3) {
      return L'\x01';
    }
LAB_00110241:
    bVar21 = (byte)local_98;
    if ((byte)local_98 == 10) {
      pcVar8 = "Protocol error: Unexpected newline";
      goto LAB_00110af2;
    }
    while( true ) {
      _Var3 = ssh_scp_recv(&local_98,1);
      pSVar2 = string_scc;
      if (!_Var3) {
        pcVar8 = "Lost connection";
        goto LAB_00110af2;
      }
      if ((byte)local_98 == '\n') break;
      BinarySink_put_byte(act->buf->binarysink_,(byte)local_98);
    }
    if (bVar21 < 0x43) {
      if (bVar21 != 1) {
        if (bVar21 == 2) {
          pcVar8 = act->buf->s;
          sVar5 = strlen(pcVar8);
          str_01.len = sVar5;
          str_01.ptr = pcVar8;
          pcVar8 = stripctrl_string_ptrlen(pSVar2,str_01);
          if (pcVar8 != (char *)0x0) {
            bump("%s",pcVar8);
          }
          goto LAB_0011061e;
        }
LAB_00110b02:
        pcVar8 = "Protocol error: Expected control record";
        goto LAB_00110af2;
      }
      pcVar8 = act->buf->s;
      sVar5 = strlen(pcVar8);
      str.len = sVar5;
      str.ptr = pcVar8;
      pcVar8 = stripctrl_string_ptrlen(pSVar2,str);
      if (pcVar8 != (char *)0x0) {
        tell_user(_stderr,"%s",pcVar8);
        safefree(pcVar8);
      }
      errs = errs + L'\x01';
    }
    else {
      if (bVar21 != 0x54) {
        if (1 < bVar21 - 0x43) {
          if (bVar21 != 0x45) goto LAB_00110b02;
LAB_0011061e:
          (*backend->vt->send)(backend,anon_var_dwarf_34748 + 10,1);
          act->action = L'\x03';
          unaff_R12 = scp_sftp_currentname;
          goto LAB_0011063d;
        }
        act->action = (uint)(bVar21 != 0x43) + L'\x01';
        if ((bVar21 != 0x43) && (recursive == '\0')) {
          pcVar8 = 
          "security violation: remote host attempted to create a subdirectory in a non-recursive copy!"
          ;
          goto LAB_00110af2;
        }
        iVar4 = __isoc99_sscanf(act->buf->s,"%lo %lu %n",&act->permissions,&act->size,&local_68);
        if (iVar4 == 2) {
          act->name = act->buf->s + (int)(uint)local_68.flags;
          unaff_R12 = scp_sftp_currentname;
          goto LAB_0011063d;
        }
        pcVar8 = "Protocol error: Illegal file descriptor format";
LAB_00110af2:
        bump(pcVar8);
      }
      iVar4 = __isoc99_sscanf(act->buf->s,"%lu %*d %lu %*d",&act->mtime);
      if (iVar4 != 2) {
        pcVar8 = "Protocol error: Illegal time format";
        goto LAB_00110af2;
      }
      act->settime = true;
      (*backend->vt->send)(backend,anon_var_dwarf_34748 + 10,1);
      strbuf_shrink_to(act->buf,0);
    }
    _Var3 = ssh_scp_recv(&local_98,1);
    if (!_Var3) goto LAB_001105c9;
    goto LAB_00110241;
  }
  if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
    if (scp_sftp_donethistarget != '\0') {
      return L'\x01';
    }
    scp_sftp_donethistarget = '\x01';
    unaff_R12 = scp_sftp_remotepath;
  }
  else {
    iVar4 = scp_sftp_dirstack_head->namepos;
    if (iVar4 < scp_sftp_dirstack_head->namelen) {
      do {
        unaff_R12 = ptr->names[iVar4].filename;
        sVar5 = strspn(unaff_R12,".");
        if ((unaff_R12[sVar5] != '\0') &&
           ((ptr->wildcard == (char *)0x0 || (iVar4 = wc_match(ptr->wildcard,unaff_R12), iVar4 != 0)
            ))) break;
        iVar4 = ptr->namepos + 1;
        ptr->namepos = iVar4;
      } while (iVar4 < ptr->namelen);
    }
    iVar4 = ptr->namepos;
    iVar12 = ptr->namelen;
    if (iVar4 < iVar12) {
      ptr->matched_something = true;
      ptr->namepos = iVar4 + 1;
      unaff_R12 = dupcat_fn(ptr->dirpath,"/",ptr->names[iVar4].filename);
    }
    else {
      if (ptr->wildcard == (char *)0x0) {
        act->action = L'\x03';
      }
      else {
        act->action = L'\x04';
        if (ptr->matched_something == false) {
          tell_user(_stderr,"pscp: wildcard \'%s\' matched no files");
          errs = errs + L'\x01';
        }
        safefree(ptr->wildcard);
      }
      safefree(ptr->dirpath);
      safefree(ptr->names);
      scp_sftp_dirstack_head = ptr->next;
      safefree(ptr);
    }
    if (iVar12 <= iVar4) {
      return L'\0';
    }
  }
  psVar6 = fxp_stat_send(unaff_R12);
  psVar7 = sftp_wait_for_reply(psVar6);
  _Var3 = fxp_stat_recv(psVar7,psVar6,&local_68);
  pSVar2 = string_scc;
  if ((_Var3) && (((uint)local_68.flags & 4) != 0)) {
    if ((local_68.permissions._1_1_ & 0x40) == 0) {
      act->action = L'\x01';
      _Var3 = false;
      strbuf_shrink_to(act->buf,0);
      psVar1 = act->buf;
      pcVar8 = stripslashes(unaff_R12,false);
      BinarySink_put_asciz(psVar1->binarysink_,pcVar8);
      act->name = act->buf->s;
      act->size = -(ulong)(((uint)local_68.flags & 1) == 0) | local_68.size;
      act->permissions =
           (ulong)(CONCAT11(local_68.permissions._1_1_,(undefined1)local_68.permissions) & 0xfff);
      if ((((uint)local_68.flags & 8) != 0) && (scp_sftp_preserve != false)) {
        act->atime = local_68.atime;
        act->mtime = local_68.mtime;
        _Var3 = true;
      }
      act->settime = _Var3;
      if (ptr == (scp_sftp_dirstack *)0x0) {
        unaff_R12 = dupstr(unaff_R12);
      }
    }
    else if ((scp_sftp_recursive == false) && (scp_sftp_wildcard == (char *)0x0)) {
      sVar5 = strlen(unaff_R12);
      str_02.len = sVar5;
      str_02.ptr = unaff_R12;
      pcVar8 = stripctrl_string_ptrlen(pSVar2,str_02);
      if (pcVar8 != (char *)0x0) {
        tell_user(_stderr,"pscp: %s: is a directory",pcVar8);
        safefree(pcVar8);
      }
      errs = errs + L'\x01';
      if (ptr != (scp_sftp_dirstack *)0x0) {
        safefree(unaff_R12);
      }
      if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) goto LAB_001105c9;
LAB_00110a5d:
      act->action = L'\x04';
      unaff_R12 = scp_sftp_currentname;
    }
    else {
      psVar6 = fxp_opendir_send(unaff_R12);
      psVar7 = sftp_wait_for_reply(psVar6);
      handle = fxp_opendir_recv(psVar7,psVar6);
      pSVar2 = string_scc;
      if (handle == (fxp_handle *)0x0) {
        sVar5 = strlen(unaff_R12);
        str_05.len = sVar5;
        str_05.ptr = unaff_R12;
        pcVar8 = stripctrl_string_ptrlen(pSVar2,str_05);
        pFVar17 = _stderr;
        if (pcVar8 != (char *)0x0) {
          pcVar13 = fxp_error();
          fmt = "pscp: unable to open directory %s: %s";
          goto LAB_001105a7;
        }
        goto LAB_001105b6;
      }
      local_98 = 0;
      local_90 = 0;
      local_a0 = (fxp_name *)0x0;
      local_88 = 0;
      local_78 = ptr;
      local_80 = unaff_R12;
      local_70 = handle;
      do {
        psVar6 = fxp_readdir_send(handle);
        psVar7 = sftp_wait_for_reply(psVar6);
        names = fxp_readdir_recv(psVar7,psVar6);
        if (names == (fxp_names *)0x0) {
          iVar4 = fxp_error_type();
          pSVar2 = string_scc;
          iVar12 = 0xe;
          if (iVar4 != 1) {
            sVar5 = strlen(unaff_R12);
            str_04.len = sVar5;
            str_04.ptr = unaff_R12;
            pcVar8 = stripctrl_string_ptrlen(pSVar2,str_04);
            pFVar17 = _stderr;
            if (pcVar8 != (char *)0x0) {
              pcVar13 = fxp_error();
              unaff_R12 = local_80;
              tell_user(pFVar17,"pscp: reading directory %s: %s",pcVar8,pcVar13);
              safefree(pcVar8);
            }
            psVar6 = fxp_close_send(handle);
            psVar7 = sftp_wait_for_reply(psVar6);
            fxp_close_recv(psVar7,psVar6);
            if (ptr != (scp_sftp_dirstack *)0x0) {
              safefree(unaff_R12);
            }
            safefree(local_a0);
            errs = errs + L'\x01';
            iVar12 = 1;
            local_88 = 1;
          }
        }
        else if ((long)names->nnames == 0) {
          fxp_free_names(names);
          iVar12 = 0xe;
        }
        else {
          local_a0 = (fxp_name *)
                     safegrowarray(local_a0,&local_98,0x48,local_90,(long)names->nnames,false);
          if (0 < names->nnames) {
            lVar19 = 0;
            lVar20 = 0;
            do {
              pcVar8 = *(char **)((long)&names->names->filename + lVar19);
              iVar4 = strcmp(pcVar8,".");
              if ((iVar4 != 0) && (iVar4 = strcmp(pcVar8,".."), iVar4 != 0)) {
                _Var3 = vet_filename(pcVar8);
                pSVar2 = string_scc;
                if (_Var3) {
                  sVar14 = local_90 + 1;
                  puVar16 = (undefined8 *)((long)&names->names->filename + lVar19);
                  pfVar18 = local_a0 + local_90;
                  for (lVar15 = 9; local_90 = sVar14, lVar15 != 0; lVar15 = lVar15 + -1) {
                    pfVar18->filename = (char *)*puVar16;
                    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
                    pfVar18 = (fxp_name *)((long)pfVar18 + (ulong)bVar21 * -0x10 + 8);
                  }
                }
                else {
                  pcVar8 = *(char **)((long)&names->names->filename + lVar19);
                  sVar5 = strlen(pcVar8);
                  str_03.len = sVar5;
                  str_03.ptr = pcVar8;
                  pcVar8 = stripctrl_string_ptrlen(pSVar2,str_03);
                  ptr = local_78;
                  if (pcVar8 != (char *)0x0) {
                    tell_user(_stderr,
                              "ignoring potentially dangerous server-supplied filename \'%s\'",
                              pcVar8);
                    safefree(pcVar8);
                    ptr = local_78;
                  }
                }
              }
              lVar20 = lVar20 + 1;
              lVar19 = lVar19 + 0x48;
            } while (lVar20 < names->nnames);
          }
          names->nnames = 0;
          fxp_free_names(names);
          iVar12 = 0;
          unaff_R12 = local_80;
          handle = local_70;
        }
      } while (iVar12 == 0);
      if (iVar12 != 0xe) {
        return (wchar_t)local_88;
      }
      psVar6 = fxp_close_send(handle);
      psVar7 = sftp_wait_for_reply(psVar6);
      fxp_close_recv(psVar7,psVar6);
      psVar9 = (scp_sftp_dirstack *)safemalloc(1,0x30,0);
      psVar9->next = scp_sftp_dirstack_head;
      psVar9->names = local_a0;
      psVar9->namepos = 0;
      psVar9->namelen = (int)local_90;
      pcVar8 = unaff_R12;
      if (ptr == (scp_sftp_dirstack *)0x0) {
        pcVar8 = dupstr(unaff_R12);
      }
      psVar9->dirpath = pcVar8;
      if (scp_sftp_wildcard == (char *)0x0) {
        ppcVar10 = &psVar9->wildcard;
      }
      else {
        psVar9->wildcard = scp_sftp_wildcard;
        psVar9->matched_something = false;
        ppcVar10 = &scp_sftp_wildcard;
      }
      *ppcVar10 = (char *)0x0;
      scp_sftp_dirstack_head = psVar9;
      if (psVar9->wildcard != (char *)0x0) goto LAB_00110a5d;
      act->action = L'\x02';
      strbuf_shrink_to(act->buf,0);
      psVar1 = act->buf;
      pcVar8 = stripslashes(unaff_R12,false);
      BinarySink_put_asciz(psVar1->binarysink_,pcVar8);
      act->name = act->buf->s;
      act->size = 0;
      act->permissions =
           (ulong)(CONCAT11(local_68.permissions._1_1_,(undefined1)local_68.permissions) & 0xfff);
      if ((scp_sftp_preserve == true) && (((uint)local_68.flags & 8) != 0)) {
        act->atime = local_68.atime;
        act->mtime = local_68.mtime;
        act->settime = true;
        unaff_R12 = scp_sftp_currentname;
      }
      else {
        act->settime = false;
        unaff_R12 = scp_sftp_currentname;
      }
    }
LAB_0011063d:
    scp_sftp_currentname = unaff_R12;
    wVar11 = L'\0';
  }
  else {
    sVar5 = strlen(unaff_R12);
    str_00.len = sVar5;
    str_00.ptr = unaff_R12;
    pcVar8 = stripctrl_string_ptrlen(pSVar2,str_00);
    pFVar17 = _stderr;
    if (pcVar8 != (char *)0x0) {
      if (_Var3) {
        pcVar13 = "file type not supplied";
      }
      else {
        pcVar13 = fxp_error();
      }
      fmt = "unable to identify %s: %s";
LAB_001105a7:
      tell_user(pFVar17,fmt,pcVar8,pcVar13);
      safefree(pcVar8);
    }
LAB_001105b6:
    if (ptr != (scp_sftp_dirstack *)0x0) {
      safefree(unaff_R12);
    }
    errs = errs + L'\x01';
LAB_001105c9:
    wVar11 = L'\x01';
  }
  return wVar11;
}

Assistant:

int scp_get_sink_action(struct scp_sink_action *act)
{
    if (using_sftp) {
        char *fname;
        bool must_free_fname;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (!scp_sftp_dirstack_head) {
            if (!scp_sftp_donethistarget) {
                /*
                 * Simple case: we are only dealing with one file.
                 */
                fname = scp_sftp_remotepath;
                must_free_fname = false;
                scp_sftp_donethistarget = true;
            } else {
                /*
                 * Even simpler case: one file _which we've done_.
                 * Return 1 (finished).
                 */
                return 1;
            }
        } else {
            /*
             * We're now in the middle of stepping through a list
             * of names returned from fxp_readdir(); so let's carry
             * on.
             */
            struct scp_sftp_dirstack *head = scp_sftp_dirstack_head;
            while (head->namepos < head->namelen &&
                   (is_dots(head->names[head->namepos].filename) ||
                    (head->wildcard &&
                     !wc_match(head->wildcard,
                               head->names[head->namepos].filename))))
                head->namepos++;       /* skip . and .. */
            if (head->namepos < head->namelen) {
                head->matched_something = true;
                fname = dupcat(head->dirpath, "/",
                               head->names[head->namepos++].filename);
                must_free_fname = true;
            } else {
                /*
                 * We've come to the end of the list; pop it off
                 * the stack and return an ENDDIR action (or RETRY
                 * if this was a wildcard match).
                 */
                if (head->wildcard) {
                    act->action = SCP_SINK_RETRY;
                    if (!head->matched_something) {
                        tell_user(stderr, "pscp: wildcard '%s' matched "
                                  "no files", head->wildcard);
                        errs++;
                    }
                    sfree(head->wildcard);

                } else {
                    act->action = SCP_SINK_ENDDIR;
                }

                sfree(head->dirpath);
                sfree(head->names);
                scp_sftp_dirstack_head = head->next;
                sfree(head);

                return 0;
            }
        }

        /*
         * Now we have a filename. Stat it, and see if it's a file
         * or a directory.
         */
        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
            with_stripctrl(san, fname)
                tell_user(stderr, "unable to identify %s: %s", san,
                          ret ? "file type not supplied" : fxp_error());
            if (must_free_fname) sfree(fname);
            errs++;
            return 1;
        }

        if (attrs.permissions & 0040000) {
            struct scp_sftp_dirstack *newitem;
            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name *ournames;
            struct fxp_names *names;

            /*
             * It's a directory. If we're not in recursive mode,
             * this merits a complaint (which is fatal if the name
             * was specified directly, but not if it was matched by
             * a wildcard).
             *
             * We skip this complaint completely if
             * scp_sftp_wildcard is set, because that's an
             * indication that we're not actually supposed to
             * _recursively_ transfer the dir, just scan it for
             * things matching the wildcard.
             */
            if (!scp_sftp_recursive && !scp_sftp_wildcard) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: %s: is a directory", san);
                errs++;
                if (must_free_fname) sfree(fname);
                if (scp_sftp_dirstack_head) {
                    act->action = SCP_SINK_RETRY;
                    return 0;
                } else {
                    return 1;
                }
            }

            /*
             * Otherwise, the fun begins. We must fxp_opendir() the
             * directory, slurp the filenames into memory, return
             * SCP_SINK_DIR (unless this is a wildcard match), and
             * set targetisdir. The next time we're called, we will
             * run through the list of filenames one by one,
             * matching them against a wildcard if present.
             *
             * If targetisdir is _already_ set (meaning we're
             * already in the middle of going through another such
             * list), we must push the other (target,namelist) pair
             * on a stack.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: unable to open directory %s: %s",
                              san, fxp_error());
                if (must_free_fname) sfree(fname);
                errs++;
                return 1;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        tell_user(stderr, "pscp: reading directory %s: %s",
                                  san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    if (must_free_fname) sfree(fname);
                    sfree(ournames);
                    errs++;
                    return 1;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++) {
                    if (!strcmp(names->names[i].filename, ".") ||
                        !strcmp(names->names[i].filename, "..")) {
                        /*
                         * . and .. are normal consequences of
                         * reading a directory, and aren't worth
                         * complaining about.
                         */
                    } else if (!vet_filename(names->names[i].filename)) {
                        with_stripctrl(san, names->names[i].filename)
                            tell_user(stderr, "ignoring potentially dangerous "
                                      "server-supplied filename '%s'", san);
                    } else
                        ournames[nnames++] = names->names[i];
                }
                names->nnames = 0;             /* prevent free_names */
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            newitem = snew(struct scp_sftp_dirstack);
            newitem->next = scp_sftp_dirstack_head;
            newitem->names = ournames;
            newitem->namepos = 0;
            newitem->namelen = nnames;
            if (must_free_fname)
                newitem->dirpath = fname;
            else
                newitem->dirpath = dupstr(fname);
            if (scp_sftp_wildcard) {
                newitem->wildcard = scp_sftp_wildcard;
                newitem->matched_something = false;
                scp_sftp_wildcard = NULL;
            } else {
                newitem->wildcard = NULL;
            }
            scp_sftp_dirstack_head = newitem;

            if (newitem->wildcard) {
                act->action = SCP_SINK_RETRY;
            } else {
                act->action = SCP_SINK_DIR;
                strbuf_clear(act->buf);
                put_asciz(act->buf, stripslashes(fname, false));
                act->name = act->buf->s;
                act->size = 0;     /* duhh, it's a directory */
                act->permissions = 07777 & attrs.permissions;
                if (scp_sftp_preserve &&
                    (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                    act->atime = attrs.atime;
                    act->mtime = attrs.mtime;
                    act->settime = true;
                } else
                    act->settime = false;
            }
            return 0;

        } else {
            /*
             * It's a file. Return SCP_SINK_FILE.
             */
            act->action = SCP_SINK_FILE;
            strbuf_clear(act->buf);
            put_asciz(act->buf, stripslashes(fname, false));
            act->name = act->buf->s;
            if (attrs.flags & SSH_FILEXFER_ATTR_SIZE) {
                act->size = attrs.size;
            } else
                act->size = UINT64_MAX;   /* no idea */
            act->permissions = 07777 & attrs.permissions;
            if (scp_sftp_preserve &&
                (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                act->atime = attrs.atime;
                act->mtime = attrs.mtime;
                act->settime = true;
            } else
                act->settime = false;
            if (must_free_fname)
                scp_sftp_currentname = fname;
            else
                scp_sftp_currentname = dupstr(fname);
            return 0;
        }

    } else {
        bool done = false;
        int action;
        char ch;

        act->settime = false;
        strbuf_clear(act->buf);

        while (!done) {
            if (!ssh_scp_recv(&ch, 1))
                return 1;
            if (ch == '\n')
                bump("Protocol error: Unexpected newline");
            action = ch;
            while (1) {
                if (!ssh_scp_recv(&ch, 1))
                    bump("Lost connection");
                if (ch == '\n')
                    break;
                put_byte(act->buf, ch);
            }
            switch (action) {
              case '\01':                      /* error */
                with_stripctrl(san, act->buf->s)
                    tell_user(stderr, "%s", san);
                errs++;
                continue;                      /* go round again */
              case '\02':                      /* fatal error */
                with_stripctrl(san, act->buf->s)
                    bump("%s", san);
              case 'E':
                backend_send(backend, "", 1);
                act->action = SCP_SINK_ENDDIR;
                return 0;
              case 'T':
                if (sscanf(act->buf->s, "%lu %*d %lu %*d",
                           &act->mtime, &act->atime) == 2) {
                    act->settime = true;
                    backend_send(backend, "", 1);
                    strbuf_clear(act->buf);
                    continue;          /* go round again */
                }
                bump("Protocol error: Illegal time format");
              case 'C':
              case 'D':
                act->action = (action == 'C' ? SCP_SINK_FILE : SCP_SINK_DIR);
                if (act->action == SCP_SINK_DIR && !recursive) {
                    bump("security violation: remote host attempted to create "
                         "a subdirectory in a non-recursive copy!");
                }
                break;
              default:
                bump("Protocol error: Expected control record");
            }
            /*
             * We will go round this loop only once, unless we hit
             * `continue' above.
             */
            done = true;
        }

        /*
         * If we get here, we must have seen SCP_SINK_FILE or
         * SCP_SINK_DIR.
         */
        {
            int i;
            if (sscanf(act->buf->s, "%lo %"SCNu64" %n", &act->permissions,
                       &act->size, &i) != 2)
                bump("Protocol error: Illegal file descriptor format");
            act->name = act->buf->s + i;
            return 0;
        }
    }
}